

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavEndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  ImGuiDir local_30;
  undefined1 auStack_2c [4];
  ImGuiDir clip_dir;
  ImRect bb_rel;
  ImGuiNavMoveFlags move_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) {
    NavUpdateWindowingOverlay();
  }
  unique0x00012000 = pIVar1->NavWrapRequestWindow;
  bb_rel.Max.x = (float)pIVar1->NavWrapRequestFlags;
  if ((((unique0x00012000 != (ImGuiWindow *)0x0) && (pIVar1->NavWindow == unique0x00012000)) &&
      (bVar2 = NavMoveRequestButNoResultYet(), bVar2)) &&
     ((pIVar1->NavMoveRequestForward == ImGuiNavForward_None &&
      (pIVar1->NavLayer == ImGuiNavLayer_Main)))) {
    if (bb_rel.Max.x == 0.0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2507,"void ImGui::NavEndFrame()");
    }
    _auStack_2c = stack0xffffffffffffffe8->NavRectRel[0].Min;
    bb_rel.Min = stack0xffffffffffffffe8->NavRectRel[0].Max;
    local_30 = pIVar1->NavMoveDir;
    if ((pIVar1->NavMoveDir == 0) && (((uint)bb_rel.Max.x & 5) != 0)) {
      fVar3 = (stack0xffffffffffffffe8->WindowPadding).x;
      fVar3 = ImMax<float>((stack0xffffffffffffffe8->SizeFull).x,
                           fVar3 + fVar3 + (stack0xffffffffffffffe8->ContentSize).x);
      fVar3 = fVar3 - (stack0xffffffffffffffe8->Scroll).x;
      bb_rel.Min.x = fVar3;
      auStack_2c = (undefined1  [4])fVar3;
      if (((uint)bb_rel.Max.x & 4) != 0) {
        fVar3 = ImRect::GetHeight((ImRect *)auStack_2c);
        ImRect::TranslateY((ImRect *)auStack_2c,-fVar3);
        local_30 = 2;
      }
      NavMoveRequestForward
                (pIVar1->NavMoveDir,local_30,(ImRect *)auStack_2c,(ImGuiNavMoveFlags)bb_rel.Max.x);
    }
    if ((pIVar1->NavMoveDir == 1) && (((uint)bb_rel.Max.x & 5) != 0)) {
      fVar3 = (stack0xffffffffffffffe8->Scroll).x;
      bb_rel.Min = (ImVec2)(CONCAT44(bb_rel.Min.y,fVar3) ^ 0x80000000);
      _auStack_2c = (ImVec2)(CONCAT44(clip_dir,fVar3) ^ 0x80000000);
      if (((uint)bb_rel.Max.x & 4) != 0) {
        fVar3 = ImRect::GetHeight((ImRect *)auStack_2c);
        ImRect::TranslateY((ImRect *)auStack_2c,fVar3);
        local_30 = 3;
      }
      NavMoveRequestForward
                (pIVar1->NavMoveDir,local_30,(ImRect *)auStack_2c,(ImGuiNavMoveFlags)bb_rel.Max.x);
    }
    if ((pIVar1->NavMoveDir == 2) && (((uint)bb_rel.Max.x & 10) != 0)) {
      fVar3 = (stack0xffffffffffffffe8->WindowPadding).y;
      fVar3 = ImMax<float>((stack0xffffffffffffffe8->SizeFull).y,
                           fVar3 + fVar3 + (stack0xffffffffffffffe8->ContentSize).y);
      fVar3 = fVar3 - (stack0xffffffffffffffe8->Scroll).y;
      bb_rel.Min.y = fVar3;
      clip_dir = (ImGuiDir)fVar3;
      if (((uint)bb_rel.Max.x & 8) != 0) {
        fVar3 = ImRect::GetWidth((ImRect *)auStack_2c);
        ImRect::TranslateX((ImRect *)auStack_2c,-fVar3);
        local_30 = 0;
      }
      NavMoveRequestForward
                (pIVar1->NavMoveDir,local_30,(ImRect *)auStack_2c,(ImGuiNavMoveFlags)bb_rel.Max.x);
    }
    if ((pIVar1->NavMoveDir == 3) && (((uint)bb_rel.Max.x & 10) != 0)) {
      fVar3 = (stack0xffffffffffffffe8->Scroll).y;
      bb_rel.Min = (ImVec2)(CONCAT44(fVar3,bb_rel.Min.x) ^ 0x8000000000000000);
      _auStack_2c = (ImVec2)(CONCAT44(fVar3,auStack_2c) ^ 0x8000000000000000);
      if (((uint)bb_rel.Max.x & 8) != 0) {
        fVar3 = ImRect::GetWidth((ImRect *)auStack_2c);
        ImRect::TranslateX((ImRect *)auStack_2c,fVar3);
        local_30 = 1;
      }
      NavMoveRequestForward
                (pIVar1->NavMoveDir,local_30,(ImRect *)auStack_2c,(ImGuiNavMoveFlags)bb_rel.Max.x);
    }
  }
  return;
}

Assistant:

static void ImGui::NavEndFrame()
{
    ImGuiContext& g = *GImGui;

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget != NULL)
        NavUpdateWindowingOverlay();

    // Perform wrap-around in menus
    ImGuiWindow* window = g.NavWrapRequestWindow;
    ImGuiNavMoveFlags move_flags = g.NavWrapRequestFlags;
    if (window != NULL && g.NavWindow == window && NavMoveRequestButNoResultYet() && g.NavMoveRequestForward == ImGuiNavForward_None && g.NavLayer == ImGuiNavLayer_Main)
    {
        IM_ASSERT(move_flags != 0); // No points calling this with no wrapping
        ImRect bb_rel = window->NavRectRel[0];

        ImGuiDir clip_dir = g.NavMoveDir;
        if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
        {
            bb_rel.Min.x = bb_rel.Max.x =
                ImMax(window->SizeFull.x, window->ContentSize.x + window->WindowPadding.x * 2.0f) - window->Scroll.x;
            if (move_flags & ImGuiNavMoveFlags_WrapX)
            {
                bb_rel.TranslateY(-bb_rel.GetHeight());
                clip_dir = ImGuiDir_Up;
            }
            NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
        }
        if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
        {
            bb_rel.Min.x = bb_rel.Max.x = -window->Scroll.x;
            if (move_flags & ImGuiNavMoveFlags_WrapX)
            {
                bb_rel.TranslateY(+bb_rel.GetHeight());
                clip_dir = ImGuiDir_Down;
            }
            NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
        }
        if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
        {
            bb_rel.Min.y = bb_rel.Max.y =
                ImMax(window->SizeFull.y, window->ContentSize.y + window->WindowPadding.y * 2.0f) - window->Scroll.y;
            if (move_flags & ImGuiNavMoveFlags_WrapY)
            {
                bb_rel.TranslateX(-bb_rel.GetWidth());
                clip_dir = ImGuiDir_Left;
            }
            NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
        }
        if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
        {
            bb_rel.Min.y = bb_rel.Max.y = -window->Scroll.y;
            if (move_flags & ImGuiNavMoveFlags_WrapY)
            {
                bb_rel.TranslateX(+bb_rel.GetWidth());
                clip_dir = ImGuiDir_Right;
            }
            NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
        }
    }
}